

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O3

pair<unsigned_char,_unsigned_char> __thiscall
MedianFilterCV_8U::getPairMedian(MedianFilterCV_8U *this,Mat *image,int y,int x,bool pairOnOneLine)

{
  uchar uVar1;
  byte bVar2;
  pair<unsigned_char,_unsigned_char> pVar3;
  int iVar4;
  size_t __n;
  long lVar5;
  uchar *puVar6;
  int iVar7;
  undefined7 in_register_00000081;
  uchar *puVar8;
  uchar __tmp_2;
  byte bVar9;
  long lVar10;
  size_t __n_1;
  uchar __tmp;
  byte local_e [8];
  uchar mergeResult [6];
  
  lVar10 = (long)x;
  if ((int)CONCAT71(in_register_00000081,pairOnOneLine) != 0) {
    x = y;
  }
  if (x == 1) {
    iVar4 = y + -1;
    if (pairOnOneLine) {
      lVar5 = (long)iVar4;
      this->thirdTempArray[0] =
           *(uchar *)(lVar10 + -1 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
      this->thirdTempArray[1] =
           *(uchar *)(lVar10 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
      this->thirdTempArray[2] =
           *(uchar *)(lVar10 + 1 + lVar5 * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      lVar5 = (long)y;
      this->fourthTempArray[0] =
           *(uchar *)(lVar10 + -1 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
      this->fourthTempArray[1] =
           *(uchar *)(lVar10 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
      puVar6 = (uchar *)(lVar10 + lVar5 * **(long **)(image + 0x48) + *(long *)(image + 0x10) + 1);
    }
    else {
      this->thirdTempArray[0] =
           *(uchar *)(lVar10 + -1 +
                     **(long **)(image + 0x48) * (long)iVar4 + *(long *)(image + 0x10));
      this->thirdTempArray[1] =
           *(uchar *)(lVar10 + -1 + **(long **)(image + 0x48) * (long)y + *(long *)(image + 0x10));
      this->thirdTempArray[2] =
           *(uchar *)(lVar10 + -1 +
                     **(long **)(image + 0x48) * (long)(y + 1) + *(long *)(image + 0x10));
      this->fourthTempArray[0] =
           *(uchar *)(lVar10 + (long)iVar4 * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      this->fourthTempArray[1] =
           *(uchar *)(lVar10 + (long)y * **(long **)(image + 0x48) + *(long *)(image + 0x10));
      puVar6 = (uchar *)((long)(y + 1) * **(long **)(image + 0x48) + *(long *)(image + 0x10) +
                        lVar10);
    }
    this->fourthTempArray[2] = *puVar6;
    lVar5 = 0;
    do {
      iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar5);
      iVar7 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar5);
      bVar9 = this->thirdTempArray[iVar4];
      if (this->thirdTempArray[iVar7] < bVar9) {
        this->thirdTempArray[iVar4] = this->thirdTempArray[iVar7];
        this->thirdTempArray[iVar7] = bVar9;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
    lVar5 = 0;
    do {
      iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar5);
      iVar7 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar5);
      bVar9 = this->fourthTempArray[iVar4];
      if (this->fourthTempArray[iVar7] < bVar9) {
        this->fourthTempArray[iVar4] = this->fourthTempArray[iVar7];
        this->fourthTempArray[iVar7] = bVar9;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
  }
  lVar5 = 0;
  do {
    uVar1 = this->firstTempArray[lVar5];
    this->firstTempArray[lVar5] = this->thirdTempArray[lVar5];
    this->thirdTempArray[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    uVar1 = this->secondTempArray[lVar5];
    this->secondTempArray[lVar5] = this->fourthTempArray[lVar5];
    this->fourthTempArray[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  if (pairOnOneLine) {
    lVar5 = (long)(y + 1);
    this->thirdTempArray[0] =
         *(uchar *)(lVar10 + -1 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
    this->thirdTempArray[1] =
         *(uchar *)(lVar10 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
    this->thirdTempArray[2] =
         *(uchar *)(lVar10 + 1 + lVar5 * **(long **)(image + 0x48) + *(long *)(image + 0x10));
    lVar5 = (long)(y + 2);
    this->fourthTempArray[0] =
         *(uchar *)(lVar10 + -1 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
    this->fourthTempArray[1] =
         *(uchar *)(lVar10 + **(long **)(image + 0x48) * lVar5 + *(long *)(image + 0x10));
    puVar6 = (uchar *)(lVar5 * **(long **)(image + 0x48) + *(long *)(image + 0x10) + lVar10 + 1);
  }
  else {
    this->thirdTempArray[0] =
         *(uchar *)(lVar10 + 1 +
                   **(long **)(image + 0x48) * (long)(y + -1) + *(long *)(image + 0x10));
    this->thirdTempArray[1] =
         *(uchar *)(lVar10 + 1 + **(long **)(image + 0x48) * (long)y + *(long *)(image + 0x10));
    this->thirdTempArray[2] =
         *(uchar *)(lVar10 + 1 + **(long **)(image + 0x48) * (long)(y + 1) + *(long *)(image + 0x10)
                   );
    this->fourthTempArray[0] =
         *(uchar *)(lVar10 + 2 +
                   (long)(y + -1) * **(long **)(image + 0x48) + *(long *)(image + 0x10));
    this->fourthTempArray[1] =
         *(uchar *)(lVar10 + 2 + (long)y * **(long **)(image + 0x48) + *(long *)(image + 0x10));
    puVar6 = (uchar *)((long)(y + 1) * **(long **)(image + 0x48) + *(long *)(image + 0x10) + lVar10
                      + 2);
  }
  this->fourthTempArray[2] = *puVar6;
  lVar10 = 0;
  do {
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar10);
    iVar7 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar10);
    bVar9 = this->thirdTempArray[iVar4];
    if (this->thirdTempArray[iVar7] < bVar9) {
      this->thirdTempArray[iVar4] = this->thirdTempArray[iVar7];
      this->thirdTempArray[iVar7] = bVar9;
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x18);
  lVar10 = 0;
  do {
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar10);
    iVar7 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar10);
    bVar9 = this->fourthTempArray[iVar4];
    if (this->fourthTempArray[iVar7] < bVar9) {
      this->fourthTempArray[iVar4] = this->fourthTempArray[iVar7];
      this->fourthTempArray[iVar7] = bVar9;
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x18);
  lVar10 = 0;
  iVar4 = 0;
  iVar7 = 0;
  do {
    if (iVar4 == 3) {
      bVar9 = this->secondTempArray[iVar7];
LAB_00102fb8:
      iVar7 = iVar7 + 1;
    }
    else {
      if (iVar7 == 3) {
        bVar2 = this->thirdTempArray[iVar4];
      }
      else {
        bVar9 = this->secondTempArray[iVar7];
        bVar2 = this->thirdTempArray[iVar4];
        if (bVar9 < this->thirdTempArray[iVar4]) goto LAB_00102fb8;
      }
      bVar9 = bVar2;
      iVar4 = iVar4 + 1;
    }
    local_e[lVar10] = bVar9;
    lVar10 = lVar10 + 1;
    if (lVar10 == 6) {
      iVar7 = 0;
      lVar10 = 5;
      iVar4 = 0;
      do {
        if ((iVar7 == 3) || ((iVar4 != 6 && (local_e[iVar4] < this->firstTempArray[iVar7])))) {
          puVar6 = local_e + iVar4;
          iVar4 = iVar4 + 1;
        }
        else {
          puVar6 = this->firstTempArray + iVar7;
          iVar7 = iVar7 + 1;
        }
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      iVar4 = 0;
      lVar10 = 5;
      iVar7 = 0;
      do {
        if ((iVar4 == 3) || ((iVar7 != 6 && (local_e[iVar7] < this->fourthTempArray[iVar4])))) {
          puVar8 = local_e + iVar7;
          iVar7 = iVar7 + 1;
        }
        else {
          puVar8 = this->fourthTempArray + iVar4;
          iVar4 = iVar4 + 1;
        }
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      pVar3.second = *puVar8;
      pVar3.first = *puVar6;
      return pVar3;
    }
  } while( true );
}

Assistant:

std::pair<uchar, uchar> MedianFilterCV_8U::getPairMedian(const cv::Mat &image, int y, int x, bool pairOnOneLine) {
    // PairOnOneLine - true, if we are looking for medians on one line,
    //                false, if on one column
    if ((x == 1 && !pairOnOneLine) || (y == 1 && pairOnOneLine)) {                         // 7 operations
        //if we are looking for median on second line or second column
        //need init must fill out and initialize third and fourth temp array
        if (pairOnOneLine) {                                                               // 1 operation
            initThreeAdjacentPixels(image, thirdTempArray, y - 1, x, pairOnOneLine);       // 14| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        } else {
            initThreeAdjacentPixels(image, thirdTempArray, y, x - 1, pairOnOneLine);       // 13| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        }

        sortThreeElements(thirdTempArray);                                                 // 43| 1 operations + operations of sort(42)
        sortThreeElements(fourthTempArray);                                                // 43| 1 operations + operations of sort(42)
    }

    // The values ​​sorted in the last step are written to first and second temp array
    std::swap(firstTempArray, thirdTempArray);                                             // 4 operations
    std::swap(secondTempArray, fourthTempArray);                                           // 4 operations

    if (pairOnOneLine) {                                                                   // 1 operation
        initThreeAdjacentPixels(image, thirdTempArray, y + 1, x, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y + 2, x, pairOnOneLine);          // 2 operations
    } else {
        initThreeAdjacentPixels(image, thirdTempArray, y, x + 1, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y, x + 2, pairOnOneLine);          // 2 operations
    }

    sortThreeElements(thirdTempArray);                                                     // 43| 1 operation + operations of sort(42)
    sortThreeElements(fourthTempArray);                                                    // 43| 1 operation + operations of sort(42)

    uchar mergeResult[6];                                                                  // 1 operation
    mergeTwoSortedArray(secondTempArray, 3, thirdTempArray, 3, mergeResult);               // 118| 1 operation + operations of merge(117)

    std::pair<uchar, uchar> pairOfMedians;                                                 // 1 operations

    pairOfMedians.first = getMedianOfTwoSortedArray(mergeResult, 6, firstTempArray, 3);    // 98| 3 operations + opeations of getMedian(95)
    pairOfMedians.second = getMedianOfTwoSortedArray(mergeResult, 6, fourthTempArray, 3);  // 98| 3 operations + opeations of getMedian(95)

    return pairOfMedians;                                                                  // 1 operation
}